

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rulebasedcollator.cpp
# Opt level: O0

UCollationResult
icu_63::anon_unknown_16::compareNFDIter
          (Normalizer2Impl *nfcImpl,NFDIterator *left,NFDIterator *right)

{
  UChar32 c;
  UChar32 c_00;
  int local_30;
  int local_2c;
  UChar32 rightCp;
  UChar32 leftCp;
  NFDIterator *right_local;
  NFDIterator *left_local;
  Normalizer2Impl *nfcImpl_local;
  
  while( true ) {
    while( true ) {
      c = NFDIterator::nextCodePoint(left);
      c_00 = NFDIterator::nextCodePoint(right);
      if (c != c_00) break;
      if (c < 0) {
        return UCOL_EQUAL;
      }
    }
    if (c < 0) {
      local_2c = -2;
    }
    else if (c == 0xfffe) {
      local_2c = -1;
    }
    else {
      local_2c = NFDIterator::nextDecomposedCodePoint(left,nfcImpl,c);
    }
    if (c_00 < 0) {
      local_30 = -2;
    }
    else if (c_00 == 0xfffe) {
      local_30 = -1;
    }
    else {
      local_30 = NFDIterator::nextDecomposedCodePoint(right,nfcImpl,c_00);
    }
    if (local_2c < local_30) break;
    if (local_30 < local_2c) {
      return UCOL_GREATER;
    }
  }
  return UCOL_LESS;
}

Assistant:

UCollationResult compareNFDIter(const Normalizer2Impl &nfcImpl,
                                NFDIterator &left, NFDIterator &right) {
    for(;;) {
        // Fetch the next FCD code point from each string.
        UChar32 leftCp = left.nextCodePoint();
        UChar32 rightCp = right.nextCodePoint();
        if(leftCp == rightCp) {
            if(leftCp < 0) { break; }
            continue;
        }
        // If they are different, then decompose each and compare again.
        if(leftCp < 0) {
            leftCp = -2;  // end of string
        } else if(leftCp == 0xfffe) {
            leftCp = -1;  // U+FFFE: merge separator
        } else {
            leftCp = left.nextDecomposedCodePoint(nfcImpl, leftCp);
        }
        if(rightCp < 0) {
            rightCp = -2;  // end of string
        } else if(rightCp == 0xfffe) {
            rightCp = -1;  // U+FFFE: merge separator
        } else {
            rightCp = right.nextDecomposedCodePoint(nfcImpl, rightCp);
        }
        if(leftCp < rightCp) { return UCOL_LESS; }
        if(leftCp > rightCp) { return UCOL_GREATER; }
    }
    return UCOL_EQUAL;
}